

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O0

string * strict_fstream::detail::static_method_holder::mode_to_string_abi_cxx11_(openmode mode)

{
  char cVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  _Ios_Openmode in_ESI;
  char *pcVar4;
  string *in_RDI;
  int i;
  string *res;
  int local_14;
  
  std::__cxx11::string::string((string *)in_RDI);
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    _Var2 = std::operator&(in_ESI,mode_to_string::mode_val_v[local_14]);
    if (_Var2 != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      cVar1 = std::__cxx11::string::empty();
      pcVar4 = "|";
      if (cVar1 != '\0') {
        pcVar4 = "";
      }
      std::__cxx11::string::operator+=((string *)in_RDI,pcVar4);
      std::__cxx11::string::operator+=((string *)in_RDI,mode_to_string::mode_name_v[local_14]);
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)in_RDI,"none");
  }
  return in_RDI;
}

Assistant:

static std::string mode_to_string(std::ios_base::openmode mode)
    {
        static const int n_modes = 6;
        static const std::ios_base::openmode mode_val_v[n_modes] =
            {
                std::ios_base::in,
                std::ios_base::out,
                std::ios_base::app,
                std::ios_base::ate,
                std::ios_base::trunc,
                std::ios_base::binary
            };

        static const char * mode_name_v[n_modes] =
            {
                "in",
                "out",
                "app",
                "ate",
                "trunc",
                "binary"
            };
        std::string res;
        for (int i = 0; i < n_modes; ++i)
        {
            if (mode & mode_val_v[i])
            {
                res += (! res.empty()? "|" : "");
                res += mode_name_v[i];
            }
        }
        if (res.empty()) res = "none";
        return res;
    }